

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_corner_table.cc
# Opt level: O1

bool __thiscall
draco::MeshAttributeCornerTable::InitEmpty(MeshAttributeCornerTable *this,CornerTable *table)

{
  if (table != (CornerTable *)0x0) {
    ValenceCache<draco::MeshAttributeCornerTable>::ClearValenceCache(&this->valence_cache_);
    ValenceCache<draco::MeshAttributeCornerTable>::ClearValenceCacheInaccurate
              (&this->valence_cache_);
    std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
              (&this->is_edge_on_seam_,
               (long)(int)((ulong)((long)(table->corner_to_vertex_map_).vector_.
                                         super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(table->corner_to_vertex_map_).vector_.
                                        super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2),false);
    std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
              (&this->is_vertex_on_seam_,
               (long)(int)((ulong)((long)(table->vertex_corners_).vector_.
                                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(table->vertex_corners_).vector_.
                                        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2),false);
    std::
    vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
    ::_M_fill_assign(&this->corner_to_vertex_map_,
                     (long)(int)((ulong)((long)(table->corner_to_vertex_map_).vector_.
                                               super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(table->corner_to_vertex_map_).vector_.
                                              super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 2),
                     (value_type *)&kInvalidVertexIndex);
    std::
    vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
    ::reserve(&this->vertex_to_attribute_entry_id_map_,
              (long)(int)((ulong)((long)(table->vertex_corners_).vector_.
                                        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(table->vertex_corners_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 2));
    std::
    vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ::reserve(&this->vertex_to_left_most_corner_map_,
              (long)(int)((ulong)((long)(table->vertex_corners_).vector_.
                                        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(table->vertex_corners_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 2));
    this->corner_table_ = table;
    this->no_interior_seams_ = true;
  }
  return table != (CornerTable *)0x0;
}

Assistant:

bool MeshAttributeCornerTable::InitEmpty(const CornerTable *table) {
  if (table == nullptr) {
    return false;
  }
  valence_cache_.ClearValenceCache();
  valence_cache_.ClearValenceCacheInaccurate();
  is_edge_on_seam_.assign(table->num_corners(), false);
  is_vertex_on_seam_.assign(table->num_vertices(), false);
  corner_to_vertex_map_.assign(table->num_corners(), kInvalidVertexIndex);
  vertex_to_attribute_entry_id_map_.reserve(table->num_vertices());
  vertex_to_left_most_corner_map_.reserve(table->num_vertices());
  corner_table_ = table;
  no_interior_seams_ = true;
  return true;
}